

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBGrayRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  byte bVar1;
  long lVar2;
  uint8_t uVar3;
  
  if (0 < width) {
    lVar2 = 0;
    do {
      bVar1 = src_argb[lVar2 * 4];
      uVar3 = (uint8_t)((uint)src_argb[lVar2 * 4 + 1] * 0x96 + (uint)src_argb[lVar2 * 4 + 2] * 0x4d
                        + (uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 + 0x80 >> 8);
      dst_argb[lVar2 * 4] = uVar3;
      dst_argb[lVar2 * 4 + 1] = uVar3;
      dst_argb[lVar2 * 4 + 2] = uVar3;
      dst_argb[lVar2 * 4 + 3] = src_argb[lVar2 * 4 + 3];
      lVar2 = lVar2 + 1;
    } while (width != (int)lVar2);
  }
  return;
}

Assistant:

void ARGBGrayRow_C(const uint8_t* src_argb, uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t y = RGBToYJ(src_argb[2], src_argb[1], src_argb[0]);
    dst_argb[2] = dst_argb[1] = dst_argb[0] = y;
    dst_argb[3] = src_argb[3];
    dst_argb += 4;
    src_argb += 4;
  }
}